

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

bool __thiscall ServerManager::addServer(ServerManager *this,string_view serverConfig)

{
  char cVar1;
  pointer *__ptr;
  _Head_base<0UL,_IRC_Bot_*,_false> local_38;
  undefined8 local_30;
  Config *local_28;
  
  local_28 = (Config *)
             Jupiter::Config::getSection(this->m_config,serverConfig._M_len,serverConfig._M_str);
  local_30 = Jupiter::Config::getSection(this->m_config,7,"Default");
  std::make_unique<IRC_Bot,Jupiter::Config*,Jupiter::Config*>((Config **)&local_38,&local_28);
  cVar1 = Jupiter::IRC::Client::connect();
  if (cVar1 != '\0') {
    std::
    vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>
    ::emplace_back<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>
              ((vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>
                *)&this->m_servers,(unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)&local_38);
  }
  if (local_38._M_head_impl != (IRC_Bot *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 0x10))();
  }
  return (bool)cVar1;
}

Assistant:

bool ServerManager::addServer(std::string_view serverConfig) {
	auto server = std::make_unique<IRC_Bot>(m_config->getSection(serverConfig), m_config->getSection("Default"sv));
	if (server->connect()) {
		m_servers.push_back(std::move(server));
		return true;
	}

	return false;
}